

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O3

bool __thiscall ON_BezierCurve::SetCV(ON_BezierCurve *this,int i,ON_4dPoint *point)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  double dVar6;
  
  if (this->m_cv == (double *)0x0) {
    bVar5 = false;
  }
  else {
    pdVar1 = this->m_cv + (long)i * (long)this->m_cv_stride;
    if (this->m_is_rat == 0) {
      dVar2 = point->w;
      bVar5 = (bool)(-(dVar2 != 0.0) & 1);
      dVar6 = 1.0 / dVar2;
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        dVar6 = 1.0;
      }
      *pdVar1 = point->x * dVar6;
      uVar3 = this->m_dim;
      if (((1 < (int)uVar3) && (pdVar1[1] = point->y * dVar6, uVar3 != 2)) &&
         (pdVar1[2] = dVar6 * point->z, 3 < uVar3)) {
        memset(pdVar1 + 3,0,(ulong)(uVar3 - 3) << 3);
      }
    }
    else {
      *pdVar1 = point->x;
      uVar3 = this->m_dim;
      uVar4 = uVar3;
      if (1 < (int)uVar3) {
        pdVar1[1] = point->y;
        uVar4 = 2;
        if (uVar3 != 2) {
          pdVar1[2] = point->z;
          uVar4 = 3;
          if (3 < uVar3) {
            memset(pdVar1 + 3,0,(ulong)(uVar3 - 3) << 3);
            uVar4 = this->m_dim;
          }
        }
      }
      pdVar1[(int)uVar4] = point->w;
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

double* ON_BezierCurve::CV( int i ) const
{
  return m_cv ? m_cv + (i*m_cv_stride) : 0;
}